

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyfile.c
# Opt level: O3

econf_err setDoubleValueNum(econf_file *ef,size_t num,void *v)

{
  int iVar1;
  econf_err eVar2;
  char *in_RAX;
  file_entry *pfVar3;
  char *ptr;
  char *local_18;
  
  local_18 = in_RAX;
  iVar1 = asprintf(&local_18,"%.*g",*v,0x11);
  if (iVar1 == -1) {
    eVar2 = ECONF_NOMEM;
  }
  else {
    pfVar3 = ef->file_entry;
    if (pfVar3[num].value != (char *)0x0) {
      free(pfVar3[num].value);
      pfVar3 = ef->file_entry;
    }
    pfVar3[num].value = local_18;
    eVar2 = ECONF_SUCCESS;
  }
  return eVar2;
}

Assistant:

econf_err setStringValueNum(econf_file *ef, size_t num, const void *v) {
  const char *value = (const char*) (v ? v : "");
  char *ptr;

  if ((ptr = strdup (value)) == NULL)
    return ECONF_NOMEM;

  if (ef->file_entry[num].value)
    free(ef->file_entry[num].value);

  ef->file_entry[num].value = ptr;

  return ECONF_SUCCESS;
}